

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O0

void __thiscall CEBody::CEBody(CEBody *this,CESkyCoord *coords,string *name)

{
  long lVar1;
  CESkyCoord *in_RDX;
  CESkyCoord *in_RSI;
  CEBody *in_RDI;
  string *new_name;
  
  CESkyCoord::CESkyCoord(in_RSI,in_RDX);
  (in_RDI->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEBody_001816b8;
  new_name = &in_RDI->name_;
  std::__cxx11::string::string((string *)new_name);
  init_members((CEBody *)0x15099d);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    SetName(in_RDI,new_name);
  }
  return;
}

Assistant:

CEBody::CEBody(const CESkyCoord&  coords, 
               const std::string& name) :
    CESkyCoord(coords)
{
    init_members();
    
    // Set the name if it is not empty
    if (name.size() > 0) SetName(name);
}